

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O2

int ptrlen_strcmp(ptrlen pl1,ptrlen pl2)

{
  int iVar1;
  uint uVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = pl2.len;
  uVar4 = pl1.len;
  __n = uVar3;
  if (uVar4 < uVar3) {
    __n = uVar4;
  }
  if ((__n != 0) && (iVar1 = memcmp(pl1.ptr,pl2.ptr,__n), iVar1 != 0)) {
    return iVar1;
  }
  uVar2 = 0xffffffff;
  if (uVar3 <= uVar4) {
    uVar2 = (uint)(uVar3 < uVar4);
  }
  return uVar2;
}

Assistant:

int ptrlen_strcmp(ptrlen pl1, ptrlen pl2)
{
    size_t minlen = pl1.len < pl2.len ? pl1.len : pl2.len;
    if (minlen) {  /* tolerate plX.ptr==NULL as long as plX.len==0 */
        int cmp = memcmp(pl1.ptr, pl2.ptr, minlen);
        if (cmp)
            return cmp;
    }
    return pl1.len < pl2.len ? -1 : pl1.len > pl2.len ? +1 : 0;
}